

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterSystem.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::~UnderwaterAcousticEmitterSystem
          (UnderwaterAcousticEmitterSystem *this)

{
  UnderwaterAcousticEmitterSystem *this_local;
  
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__UnderwaterAcousticEmitterSystem_0032f758;
  std::
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
  ::clear(&this->m_vUAEB);
  std::
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
  ::~vector(&this->m_vUAEB);
  Vector::~Vector(&this->m_Location);
  AcousticEmitterSystem::~AcousticEmitterSystem(&this->m_AES);
  DataTypeBase::~DataTypeBase(&this->super_DataTypeBase);
  return;
}

Assistant:

UnderwaterAcousticEmitterSystem::~UnderwaterAcousticEmitterSystem()
{
    m_vUAEB.clear();
}